

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O2

FT_Error ft_bitmap_glyph_init(FT_Glyph bitmap_glyph,FT_GlyphSlot slot)

{
  FT_UInt *pFVar1;
  FT_Library library;
  FT_Glyph_Class *pFVar2;
  FT_Pos FVar3;
  int iVar4;
  undefined4 uVar5;
  FT_Error FVar6;
  FT_Glyph_Class **abitmap;
  
  if (slot->format == FT_GLYPH_FORMAT_BITMAP) {
    library = bitmap_glyph->library;
    bitmap_glyph[1].library = *(FT_Library *)&slot->bitmap_left;
    abitmap = &bitmap_glyph[1].clazz;
    if ((slot->internal->flags & 1) == 0) {
      FT_Bitmap_Init((FT_Bitmap *)abitmap);
      FVar6 = FT_Bitmap_Copy(library,&slot->bitmap,(FT_Bitmap *)abitmap);
      return FVar6;
    }
    bitmap_glyph[2].library = (FT_Library)(slot->bitmap).palette;
    pFVar2 = *(FT_Glyph_Class **)&slot->bitmap;
    iVar4 = (slot->bitmap).pitch;
    uVar5 = *(undefined4 *)&(slot->bitmap).field_0xc;
    FVar3 = *(FT_Pos *)&(slot->bitmap).num_grays;
    bitmap_glyph[1].advance.x = (FT_Pos)(slot->bitmap).buffer;
    bitmap_glyph[1].advance.y = FVar3;
    *abitmap = pFVar2;
    bitmap_glyph[1].format = iVar4;
    *(undefined4 *)&bitmap_glyph[1].field_0x14 = uVar5;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
    FVar6 = 0;
  }
  else {
    FVar6 = 0x12;
  }
  return FVar6;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_bitmap_glyph_init( FT_Glyph      bitmap_glyph,
                        FT_GlyphSlot  slot )
  {
    FT_BitmapGlyph  glyph   = (FT_BitmapGlyph)bitmap_glyph;
    FT_Error        error   = FT_Err_Ok;
    FT_Library      library = FT_GLYPH( glyph )->library;


    if ( slot->format != FT_GLYPH_FORMAT_BITMAP )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    glyph->left = slot->bitmap_left;
    glyph->top  = slot->bitmap_top;

    /* do lazy copying whenever possible */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      glyph->bitmap          = slot->bitmap;
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }
    else
    {
      FT_Bitmap_Init( &glyph->bitmap );
      error = FT_Bitmap_Copy( library, &slot->bitmap, &glyph->bitmap );
    }

  Exit:
    return error;
  }